

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::addDirtyWidget(QWidgetRepaintManager *this,QWidget *widget,QRegion *rgn)

{
  QWidgetPrivate *pQVar1;
  QWidgetPrivate *in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  QWidgetPrivate *widgetPrivate;
  parameter_type in_stack_ffffffffffffff98;
  QWidgetPrivate *rect;
  QRect local_20;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    pQVar1 = QWidget::d_func((QWidget *)0x3a4fe5);
    if (((*(uint *)&pQVar1->field_0x250 >> 0x13 & 1) == 0) &&
       ((*(uint *)(*(long *)(in_RSI + 0x20) + 0x10) >> 0x12 & 1) == 0)) {
      pQVar1 = QWidget::d_func((QWidget *)0x3a501f);
      if (pQVar1->graphicsEffect == (QGraphicsEffect *)0x0) {
        QRegion::operator=(&pQVar1->dirty,(QRegion *)in_RDX);
      }
      else {
        rect = pQVar1;
        QRegion::boundingRect();
        local_20 = QWidgetPrivate::effectiveRectFor(in_RDX,(QRect *)rect);
        QRegion::QRegion(&local_10,(QRect *)&local_20,Rectangle);
        QRegion::operator=((QRegion *)pQVar1,(QRegion *)in_stack_ffffffffffffff98);
        QRegion::~QRegion(&local_10);
        pQVar1 = rect;
      }
      QList<QWidget_*>::append((QList<QWidget_*> *)0x3a50c6,in_stack_ffffffffffffff98);
      *(uint *)&pQVar1->field_0x250 = *(uint *)&pQVar1->field_0x250 & 0xfff7ffff | 0x80000;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::addDirtyWidget(QWidget *widget, const QRegion &rgn)
{
    if (widget && !widget->d_func()->inDirtyList && !widget->data->in_destructor) {
        QWidgetPrivate *widgetPrivate = widget->d_func();
#if QT_CONFIG(graphicseffect)
        if (widgetPrivate->graphicsEffect)
            widgetPrivate->dirty = widgetPrivate->effectiveRectFor(rgn.boundingRect());
        else
#endif // QT_CONFIG(graphicseffect)
            widgetPrivate->dirty = rgn;
        dirtyWidgets.append(widget);
        widgetPrivate->inDirtyList = true;
    }
}